

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressionlistref.cpp
# Opt level: O2

string * __thiscall
duckdb::ExpressionListRef::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionListRef *this)

{
  const_reference this_00;
  const_reference this_01;
  pointer pPVar1;
  idx_t row_idx;
  ulong __n;
  idx_t col_idx;
  ulong __n_00;
  string result;
  string local_70;
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)&result,"(VALUES ",(allocator *)local_50);
  for (__n = 0; __n < (ulong)(((long)(this->values).
                                     super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->values).
                                    super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&result);
    }
    this_00 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
              ::get<true>(&this->values,__n);
    ::std::__cxx11::string::append((char *)&result);
    for (__n_00 = 0;
        __n_00 < (ulong)((long)(this_00->
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_00->
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1)
    {
      if (__n_00 != 0) {
        ::std::__cxx11::string::append((char *)&result);
      }
      this_01 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(this_00,__n_00);
      pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01);
      (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(local_50,pPVar1);
      ::std::__cxx11::string::append((string *)&result);
      ::std::__cxx11::string::~string(local_50);
    }
    ::std::__cxx11::string::append((char *)&result);
  }
  ::std::__cxx11::string::append((char *)&result);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&result);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&local_70,&this->expected_names);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string ExpressionListRef::ToString() const {
	D_ASSERT(!values.empty());
	string result = "(VALUES ";
	for (idx_t row_idx = 0; row_idx < values.size(); row_idx++) {
		if (row_idx > 0) {
			result += ", ";
		}
		auto &row = values[row_idx];
		result += "(";
		for (idx_t col_idx = 0; col_idx < row.size(); col_idx++) {
			if (col_idx > 0) {
				result += ", ";
			}
			result += row[col_idx]->ToString();
		}
		result += ")";
	}
	result += ")";
	return BaseToString(result, expected_names);
}